

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::
strTree<kj::StringTree,char_const(&)[7],kj::StringPtr&,char_const(&)[30],kj::StringPtr&,char_const(&)[365],kj::StringTree,kj::StringTree,kj::Array<kj::StringTree>,char_const(&)[348]>
          (StringTree *__return_storage_ptr__,kj *this,StringTree *params,char (*params_1) [7],
          StringPtr *params_2,char (*params_3) [30],StringPtr *params_4,char (*params_5) [365],
          StringTree *params_6,StringTree *params_7,Array<kj::StringTree> *params_8,
          char (*params_9) [348])

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  undefined8 uVar3;
  StringPtr delim;
  ArrayPtr<const_char> *in_stack_ffffffffffffff20;
  undefined1 local_c8 [24];
  ArrayDisposer *local_b0;
  Branch *pBStack_a8;
  undefined8 *local_a0;
  ArrayDisposer *local_98;
  undefined8 uStack_90;
  undefined8 *local_88;
  undefined1 local_80 [24];
  ArrayDisposer *local_68;
  ArrayPtr<const_char> local_60;
  ArrayPtr<const_char> local_50;
  ArrayPtr<const_char> local_40;
  
  local_c8._8_8_ = strlen((char *)params);
  local_40.ptr = *(char **)params_1;
  local_40.size_ = *(long *)(params_1[1] + 1) - 1;
  local_c8._0_8_ = params;
  local_50.size_ = strlen((char *)params_2);
  local_60.ptr = *(char **)*params_3;
  local_60.size_ = *(long *)(*params_3 + 8) - 1;
  local_50.ptr = (char *)params_2;
  local_68 = (ArrayDisposer *)strlen((char *)params_4);
  local_80._16_8_ = params_4;
  delim.content.size_ = 1;
  delim.content.ptr = "";
  StringTree::StringTree((StringTree *)(local_c8 + 0x10),(Array<kj::StringTree> *)params_7,delim);
  local_80._8_8_ = strlen((char *)params_8);
  local_80._0_8_ = params_8;
  StringTree::
  concat<kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)this,(StringTree *)local_c8,&local_40,&local_50,
             &local_60,(ArrayPtr<const_char> *)(local_80 + 0x10),(ArrayPtr<const_char> *)params_5,
             params_6,(StringTree *)(local_c8 + 0x10),(StringTree *)local_80,
             in_stack_ffffffffffffff20);
  uVar3 = uStack_90;
  pAVar1 = local_98;
  if (local_98 != (ArrayDisposer *)0x0) {
    local_98 = (ArrayDisposer *)0x0;
    uStack_90 = 0;
    (**(code **)*local_88)
              (local_88,pAVar1,0x40,uVar3,uVar3,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  pBVar2 = pBStack_a8;
  pAVar1 = local_b0;
  if (local_b0 != (ArrayDisposer *)0x0) {
    local_b0 = (ArrayDisposer *)0x0;
    pBStack_a8 = (Branch *)0x0;
    (**(code **)*local_a0)(local_a0,pAVar1,1,pBVar2,pBVar2,0);
  }
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}